

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_7.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  istream *this;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  char cVar8;
  int R;
  char local_31;
  uint local_30;
  int local_2c;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_30);
  std::istream::operator>>(this,&local_2c);
  if ((int)local_30 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
    local_30 = -local_30;
  }
  uVar5 = (ulong)local_30;
  if (local_30 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      iVar4 = (int)uVar5;
      uVar2 = (long)iVar4 / (long)local_2c;
      uVar5 = uVar2 & 0xffffffff;
      lVar3 = (long)iVar4 % (long)local_2c;
      cVar8 = '7';
      if ((int)lVar3 < 10) {
        cVar8 = '0';
      }
      num[uVar7] = cVar8 + (char)lVar3;
      uVar7 = uVar7 + 1;
    } while ((int)uVar2 != 0);
    local_30 = 0;
  }
  if ((int)uVar7 == 0) {
    std::ostream::operator<<((ostream *)&std::cout,0);
  }
  if (0 < (int)uVar7) {
    uVar5 = uVar7 & 0xffffffff;
    do {
      local_31 = num[uVar5];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_31,1)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      bVar1 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

int main()
{
    int m,N,R,now;
    std::cin >> N >> R;
    if(N < 0){
        std::cout << "-";
        N = -N;
    }
    m = 0;
    while (N)           //转换进制，先求余在，在除，最后倒序输出
    {
        now = N % R;
        if(now <= 9)
        {
            num[m++] = '0' + now; //'0'表示把数字转换成char类型的数字
        }else
        {
            num[m++] = 'A' + now - 10;  //把now转换成大写字母
        }
        N /= R;
    }
    if(m == 0)
    {
        std::cout << 0;
    }
    for (int i = m ; i > 0; i--) {     //进制转换以后要倒序输出，才是转换后的结果。
        std::cout << num[i] << std::endl;
    }
    return 0;
}